

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetCurrentFont(ImFont *font)

{
  ImFontAtlas *pIVar1;
  ImGuiContext *pIVar2;
  ImFont *in_RDI;
  float fVar3;
  ImFontAtlas *atlas;
  ImGuiContext *g;
  float local_1c;
  
  pIVar2 = GImGui;
  GImGui->Font = in_RDI;
  fVar3 = ImMax<float>(1.0,(pIVar2->IO).FontGlobalScale * pIVar2->Font->FontSize *
                           pIVar2->Font->Scale);
  pIVar2->FontBaseSize = fVar3;
  if (pIVar2->CurrentWindow == (ImGuiWindow *)0x0) {
    local_1c = 0.0;
  }
  else {
    local_1c = ImGuiWindow::CalcFontSize(pIVar2->CurrentWindow);
  }
  pIVar2->FontSize = local_1c;
  pIVar1 = pIVar2->Font->ContainerAtlas;
  (pIVar2->DrawListSharedData).TexUvWhitePixel = pIVar1->TexUvWhitePixel;
  (pIVar2->DrawListSharedData).TexUvLines = pIVar1->TexUvLines;
  (pIVar2->DrawListSharedData).Font = pIVar2->Font;
  (pIVar2->DrawListSharedData).FontSize = pIVar2->FontSize;
  return;
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.TexUvLines = atlas->TexUvLines;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}